

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall CInput::HandleJoystickAxisMotionEvent(CInput *this,SDL_Event *Event)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  iVar2 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return;
  }
  if (*(Uint32 *)(CONCAT44(extraout_var,iVar2) + 0x78) != (Event->display).display) {
    return;
  }
  if (0xb < (Event->display).event) {
    return;
  }
  uVar1 = (uint)(Event->display).event * 2;
  uVar3 = (ulong)uVar1;
  fVar5 = (float)this->m_pConfig->m_JoystickTolerance / 50.0;
  fVar4 = fVar5 * -32768.0;
  if ((fVar4 < (float)(int)(Event->jaxis).value) || (this->m_aInputState[uVar3 + 0x1c2] != false)) {
    if (((float)(int)(Event->jaxis).value <= fVar4) || (this->m_aInputState[uVar3 + 0x1c2] != true))
    goto LAB_001219df;
    this->m_aInputState[uVar3 + 0x1c2] = false;
    iVar2 = 2;
  }
  else {
    iVar2 = 1;
    this->m_aInputState[uVar3 + 0x1c2] = true;
    *(short *)(this->m_aInputState + uVar3 * 2 + -0x7c) = (short)this->m_InputCounter;
  }
  AddEvent(this,(char *)0x0,uVar1 + 0x1c2,iVar2);
LAB_001219df:
  fVar5 = fVar5 * 32767.0;
  if (((float)(int)(Event->jaxis).value < fVar5) || (this->m_aInputState[uVar3 + 0x1c3] != false)) {
    if ((fVar5 <= (float)(int)(Event->jaxis).value) || (this->m_aInputState[uVar3 + 0x1c3] != true))
    {
      return;
    }
    iVar2 = 2;
    this->m_aInputState[uVar3 + 0x1c3] = false;
  }
  else {
    this->m_aInputState[uVar3 + 0x1c3] = true;
    *(short *)(this->m_aInputState + uVar3 * 2 + -0x7a) = (short)this->m_InputCounter;
    iVar2 = 1;
  }
  AddEvent(this,(char *)0x0,uVar1 + 0x1c3,iVar2);
  return;
}

Assistant:

void CInput::HandleJoystickAxisMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jaxis.which)
		return;
	if(Event.jaxis.axis >= NUM_JOYSTICK_AXES)
		return;

	const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Event.jaxis.axis;
	const int RightKey = LeftKey + 1;
	const float DeadZone = GetJoystickDeadzone();

	if(Event.jaxis.value <= SDL_JOYSTICK_AXIS_MIN * DeadZone && !m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = true;
		m_aInputCount[LeftKey] = m_InputCounter;
		AddEvent(0, LeftKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value > SDL_JOYSTICK_AXIS_MIN * DeadZone && m_aInputState[LeftKey])
	{
		m_aInputState[LeftKey] = false;
		AddEvent(0, LeftKey, IInput::FLAG_RELEASE);
	}

	if(Event.jaxis.value >= SDL_JOYSTICK_AXIS_MAX * DeadZone && !m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = true;
		m_aInputCount[RightKey] = m_InputCounter;
		AddEvent(0, RightKey, IInput::FLAG_PRESS);
	}
	else if(Event.jaxis.value < SDL_JOYSTICK_AXIS_MAX * DeadZone && m_aInputState[RightKey])
	{
		m_aInputState[RightKey] = false;
		AddEvent(0, RightKey, IInput::FLAG_RELEASE);
	}
}